

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_ldiv(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  ulong uVar1;
  ostream *poVar2;
  Value VVar3;
  Value VVar4;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  Frame::popTopOfOperandStack(this_01);
  VVar4 = Frame::popTopOfOperandStack(this_01);
  uVar1 = VVar4._0_8_;
  if (VVar3.type != LONG) {
    __assert_fail("value_2.type == ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x884,"void ExecutionEngine::i_ldiv()");
  }
  if ((uVar1 & 0xffffffff00000000) == 0x600000000) {
    if (VVar3.data.longValue != 0) {
      VVar3.data.longValue = VVar4.data.longValue / VVar3.data.longValue;
      VVar3.printType = (int)uVar1;
      VVar3.type = (int)(uVar1 >> 0x20);
      Frame::pushIntoOperandStack(this_01,VVar3);
      this_01->pc = this_01->pc + 1;
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"ArithmeticException");
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(2);
  }
  __assert_fail("value_1.type == ValueType::LONG",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x885,"void ExecutionEngine::i_ldiv()");
}

Assistant:

void ExecutionEngine::i_ldiv() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();

	assert(value_2.type == ValueType::LONG);
	assert(value_1.type == ValueType::LONG);
	if (value_2.data.longValue == 0) {
		cerr << "ArithmeticException" << endl;
		exit(2);
	}

	value_1.data.longValue = value_1.data.longValue / (value_2.data.longValue);
	topFrame->pushIntoOperandStack(value_1);

	topFrame->pc += 1;
}